

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O2

uint16_t __thiscall r_exec::IPGMContext::getChildrenCount(IPGMContext *this)

{
  Data DVar1;
  byte bVar2;
  uint16_t uVar3;
  
  DVar1 = (this->super__Context).data;
  if (DVar1 == VWS) {
    (*(this->object->super__Object)._vptr__Object[0x11])();
    uVar3 = (uint16_t)(this->object->views)._M_h._M_element_count;
    (*(this->object->super__Object)._vptr__Object[0x12])();
  }
  else if (DVar1 == MKS) {
    (*(this->object->super__Object)._vptr__Object[0x13])();
    uVar3 = (uint16_t)(this->object->markers).used_cell_count;
    (*(this->object->super__Object)._vptr__Object[0x14])();
  }
  else {
    bVar2 = r_code::Atom::getAtomCount();
    uVar3 = (uint16_t)bVar2;
  }
  return uVar3;
}

Assistant:

uint16_t getChildrenCount() const
    {
        uint16_t c;

        switch (data) {
        case MKS:
            object->acq_markers();
            c = object->markers.size();
            object->rel_markers();
            return c;

        case VWS:
            object->acq_views();
            c = object->views.size();
            object->rel_views();
            return c;

        default:
            return code[index].getAtomCount();
        }
    }